

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O1

void __thiscall
booster::locale::impl_icu::calendar_impl::adjust_value
          (calendar_impl *this,period_mark p,update_type u,int difference)

{
  Calendar *pCVar1;
  UCalendarDateFields UVar2;
  long lVar3;
  UErrorCode err;
  UErrorCode local_1c;
  
  local_1c = U_ZERO_ERROR;
  if (u == move) {
    lVar3 = 0x38;
  }
  else {
    if (u != roll) goto LAB_00182874;
    lVar3 = 0x48;
  }
  pCVar1 = (this->calendar_).ptr_;
  UVar2 = to_icu(p);
  (**(code **)(*(long *)pCVar1 + lVar3))(pCVar1,UVar2,difference,&local_1c);
LAB_00182874:
  check_and_throw_dt(&local_1c);
  return;
}

Assistant:

virtual void adjust_value(period::marks::period_mark p,update_type u,int difference)
        {
            UErrorCode err=U_ZERO_ERROR;
            switch(u) {
            case move:
                calendar_->add(to_icu(p),difference,err);
                break;
            case roll:
                calendar_->roll(to_icu(p),difference,err);
                break;
            }
            check_and_throw_dt(err);
        }